

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall QPDFTokenizer::Token::Token(Token *this,token_type_e type,string *value)

{
  QPDFObjectHandle local_90;
  string local_80;
  QPDFObjectHandle local_60;
  string local_50;
  string *local_20;
  string *value_local;
  Token *pTStack_10;
  token_type_e type_local;
  Token *this_local;
  
  this->type = type;
  local_20 = value;
  value_local._4_4_ = type;
  pTStack_10 = this;
  std::__cxx11::string::string((string *)&this->value,(string *)value);
  std::__cxx11::string::string((string *)&this->raw_value,(string *)local_20);
  std::__cxx11::string::string((string *)&this->error_message);
  if (value_local._4_4_ == tt_string) {
    QPDFObjectHandle::newString(&local_60,local_20);
    QPDFObjectHandle::unparse_abi_cxx11_(&local_50,&local_60);
    std::__cxx11::string::operator=((string *)&this->raw_value,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    QPDFObjectHandle::~QPDFObjectHandle(&local_60);
  }
  else if (value_local._4_4_ == tt_name) {
    QPDFObjectHandle::newName(&local_90,local_20);
    QPDFObjectHandle::unparse_abi_cxx11_(&local_80,&local_90);
    std::__cxx11::string::operator=((string *)&this->raw_value,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    QPDFObjectHandle::~QPDFObjectHandle(&local_90);
  }
  return;
}

Assistant:

QPDFTokenizer::Token::Token(token_type_e type, std::string const& value) :
    type(type),
    value(value),
    raw_value(value)
{
    if (type == tt_string) {
        raw_value = QPDFObjectHandle::newString(value).unparse();
    } else if (type == tt_name) {
        raw_value = QPDFObjectHandle::newName(value).unparse();
    }
}